

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# game_text.cpp
# Opt level: O3

void __thiscall GameText::GameText(GameText *this,string *text,uint8_t lines_in_textbox)

{
  (this->_initial_text)._M_dataplus._M_p = (pointer)&(this->_initial_text).field_2;
  (this->_initial_text)._M_string_length = 0;
  (this->_initial_text).field_2._M_local_buf[0] = '\0';
  (this->_output_text)._M_dataplus._M_p = (pointer)&(this->_output_text).field_2;
  (this->_output_text)._M_string_length = 0;
  (this->_output_text).field_2._M_local_buf[0] = '\0';
  this->_current_line_length = 0;
  this->_current_line_count = '\0';
  this->_lines_in_textbox = lines_in_textbox;
  GameText::text(this,text);
  return;
}

Assistant:

GameText::GameText(const std::string& text, uint8_t lines_in_textbox) :
    _lines_in_textbox(lines_in_textbox)
{
    this->text(text);
}